

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

void http_handle_dir(nng_http *conn,void *arg,nng_aio *aio)

{
  _Bool _Var1;
  int iVar2;
  nng_err result;
  char *__s1;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sz;
  char *pcVar6;
  char *pcVar7;
  nng_http_status local_84;
  nng_http_status status;
  char *pn;
  size_t pnsz;
  size_t len;
  char *dst;
  char *ctype;
  char *uri;
  char *base;
  char *path;
  http_file *hf;
  size_t sStack_30;
  nng_err rv;
  size_t size;
  void *data;
  nng_aio *aio_local;
  void *arg_local;
  nng_http *conn_local;
  
  pcVar7 = *(char **)((long)arg + 8);
  pcVar6 = *arg;
  data = aio;
  aio_local = (nng_aio *)arg;
  arg_local = conn;
  __s1 = nni_http_get_uri(conn);
  sVar3 = strlen(pcVar6);
  if ((pcVar6[1] == '\0') ||
     ((iVar2 = strncmp(__s1,pcVar6,sVar3), iVar2 == 0 &&
      ((__s1[sVar3] == '\0' || (__s1[sVar3] == '/')))))) {
    sVar4 = strlen(pcVar7);
    sVar5 = strlen(__s1);
    sz = sVar4 + sVar5 + 0xd;
    pcVar6 = (char *)nni_alloc(sz);
    if (pcVar6 == (char *)0x0) {
      nni_aio_finish_error((nni_aio *)data,NNG_ENOMEM);
    }
    else {
      strcpy(pcVar6,pcVar7);
      sVar4 = strlen(pcVar6);
      pcVar7 = pcVar6 + sVar4;
      if ((pcVar7 == pcVar6) || (len = (size_t)pcVar7, pcVar7[-1] != '/')) {
        len = (size_t)(pcVar7 + 1);
        *pcVar7 = '/';
      }
      for (ctype = __s1 + sVar3; (*ctype != '\0' && (*ctype != '?')); ctype = ctype + 1) {
        if (*ctype == '/') {
          strcpy((char *)len,"/");
        }
        else {
          *(char *)len = *ctype;
        }
        len = len + 1;
      }
      *(undefined1 *)len = 0;
      hf._4_4_ = 0;
      _Var1 = nni_file_is_dir(pcVar6);
      if (_Var1) {
        sVar3 = strlen(pcVar6);
        snprintf((char *)len,sz - sVar3,"%s%s","/","index.html");
        _Var1 = nni_file_is_file(pcVar6);
        if (!_Var1) {
          sVar3 = strlen(pcVar6);
          pcVar6[sVar3 - 1] = '\0';
          _Var1 = nni_file_is_file(pcVar6);
          if (!_Var1) {
            hf._4_4_ = 0xc;
          }
        }
      }
      if (hf._4_4_ == 0) {
        hf._4_4_ = nni_file_get(pcVar6,(void **)&size,&stack0xffffffffffffffd0);
      }
      else {
        size = 0;
        sStack_30 = 0;
      }
      dst = http_lookup_type(pcVar6);
      if (dst == (char *)0x0) {
        dst = "application/octet-stream";
      }
      nni_free(pcVar6,sz);
      if (hf._4_4_ == 0) {
        hf._4_4_ = nng_http_set_header((nng_http *)arg_local,"Content-Type",dst);
        if ((hf._4_4_ == NNG_OK) &&
           (hf._4_4_ = nng_http_copy_body((nng_http *)arg_local,(void *)size,sStack_30),
           hf._4_4_ == NNG_OK)) {
          nng_http_set_status((nng_http *)arg_local,NNG_HTTP_STATUS_OK,(char *)0x0);
          nni_free((void *)size,sStack_30);
          nni_aio_finish((nni_aio *)data,NNG_OK,0);
        }
        else {
          nni_free((void *)size,sStack_30);
          nni_aio_finish_error((nni_aio *)data,hf._4_4_);
        }
      }
      else {
        if (hf._4_4_ == 2) {
          local_84 = NNG_HTTP_STATUS_INTERNAL_SERVER_ERROR;
        }
        else if (hf._4_4_ == 0xc) {
          local_84 = NNG_HTTP_STATUS_NOT_FOUND;
        }
        else if (hf._4_4_ == 0x10) {
          local_84 = NNG_HTTP_STATUS_FORBIDDEN;
        }
        else {
          local_84 = NNG_HTTP_STATUS_INTERNAL_SERVER_ERROR;
        }
        result = nni_http_set_error((nng_http *)arg_local,local_84,(char *)0x0,(char *)0x0);
        if (result == NNG_OK) {
          nni_aio_finish((nni_aio *)data,NNG_OK,0);
        }
        else {
          nni_aio_finish_error((nni_aio *)data,result);
        }
      }
    }
  }
  else {
    nni_aio_finish_error((nni_aio *)data,NNG_EINVAL);
  }
  return;
}

Assistant:

static void
http_handle_dir(nng_http *conn, void *arg, nng_aio *aio)
{
	void       *data;
	size_t      size;
	nng_err     rv;
	http_file  *hf   = arg;
	const char *path = hf->path;
	const char *base = hf->base;
	const char *uri  = nni_http_get_uri(conn);
	const char *ctype;
	char       *dst;
	size_t      len;
	size_t      pnsz;
	char       *pn;

	len = strlen(base);
	if (base[1] != '\0' && // Allows "/" as base
	    ((strncmp(uri, base, len) != 0) ||
	        ((uri[len] != 0) && (uri[len] != '/')))) {
		// This should never happen!
		nni_aio_finish_error(aio, NNG_EINVAL);
		return;
	}

	// simple worst case is every character in path is a separator
	// It's never actually that bad, because we we have /<something>/.
	pnsz = (strlen(path) + strlen(uri) + 2) * strlen(NNG_PLATFORM_DIR_SEP);
	pnsz += strlen("index.html") + 1; // +1 for term nul

	if ((pn = nni_alloc(pnsz)) == NULL) {
		nni_aio_finish_error(aio, NNG_ENOMEM);
		return;
	}

	// make sure we have a "/" present.
	strcpy(pn, path);
	dst = pn + strlen(pn);

	if ((dst == pn) || (dst[-1] != '/')) {
		*dst++ = '/';
	}

	for (uri = uri + len; *uri != '\0'; uri++) {
		if (*uri == '?') {
			// Skip URI parameters
			break;
		} else if (*uri == '/') {
			strcpy(dst, NNG_PLATFORM_DIR_SEP);
			dst += sizeof(NNG_PLATFORM_DIR_SEP) - 1;
		} else {
			*dst++ = *uri;
		}
	}

	*dst = '\0';

	// This is a very simplistic file server, suitable only for small
	// files.  In the future we can use an AIO based file read, where
	// we read files a bit at a time, or even mmap them, and serve
	// them up chunkwise.  Applications could even come up with their
	// own caching version of the http handler.

	rv = 0;
	if (nni_file_is_dir(pn)) {
		snprintf(dst, pnsz - strlen(pn), "%s%s", NNG_PLATFORM_DIR_SEP,
		    "index.html");
		if (!nni_file_is_file(pn)) {
			pn[strlen(pn) - 1] = '\0'; // index.html -> index.htm
			if (!nni_file_is_file(pn)) {
				rv = NNG_ENOENT;
			}
		}
	}

	if (rv == NNG_OK) {
		rv = nni_file_get(pn, &data, &size);
	} else {
		data = NULL;
		size = 0;
	}
	ctype = http_lookup_type(pn);
	if (ctype == NULL) {
		ctype = "application/octet-stream";
	}

	nni_free(pn, pnsz);
	if (rv != NNG_OK) {
		nng_http_status status;

		switch (rv) {
		case NNG_ENOMEM:
			status = NNG_HTTP_STATUS_INTERNAL_SERVER_ERROR;
			break;
		case NNG_ENOENT:
			status = NNG_HTTP_STATUS_NOT_FOUND;
			break;
		case NNG_EPERM:
			status = NNG_HTTP_STATUS_FORBIDDEN;
			break;
		default:
			status = NNG_HTTP_STATUS_INTERNAL_SERVER_ERROR;
			break;
		}
		if ((rv = nni_http_set_error(conn, status, NULL, NULL)) != 0) {
			nni_aio_finish_error(aio, rv);
			return;
		}
		nni_aio_finish(aio, 0, 0);
		return;
	}

	if (((rv = nng_http_set_header(conn, "Content-Type", ctype)) != 0) ||
	    ((rv = nng_http_copy_body(conn, data, size)) != 0)) {
		nni_free(data, size);
		nni_aio_finish_error(aio, rv);
		return;
	}

	nng_http_set_status(conn, NNG_HTTP_STATUS_OK, NULL);

	nni_free(data, size);
	nni_aio_finish(aio, NNG_OK, 0);
}